

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall AbstractTaskProvider::_taskRun(AbstractTaskProvider *this,bool skip)

{
  __atomic_base<unsigned_long> *this_00;
  __atomic_base<unsigned_long> *p_Var1;
  __int_type _Var2;
  __int_type _Var3;
  byte in_SIL;
  mutex *in_RDI;
  size_t completedTasks;
  size_t taskId;
  __atomic_base<unsigned_long> *this_01;
  
  this_00 = (__atomic_base<unsigned_long> *)
            std::__atomic_base<unsigned_long>::operator++
                      ((__atomic_base<unsigned_long> *)
                       ((long)&(in_RDI->super___mutex_base)._M_mutex + 0x10),0);
  this_01 = this_00;
  p_Var1 = (__atomic_base<unsigned_long> *)
           std::__atomic_base::operator_cast_to_unsigned_long(this_00);
  if (this_01 < p_Var1) {
    if ((in_SIL & 1) == 0) {
      (**(code **)((in_RDI->super___mutex_base)._M_mutex.__align + 0x10))(in_RDI,this_00);
    }
    _Var2 = std::__atomic_base<unsigned_long>::operator++
                      ((__atomic_base<unsigned_long> *)
                       &(in_RDI->super___mutex_base)._M_mutex.__data.__list);
    _Var3 = std::__atomic_base::operator_cast_to_unsigned_long(this_01);
    if (_Var2 == _Var3) {
      std::mutex::lock(in_RDI);
      (in_RDI->super___mutex_base)._M_mutex.__size[0x20] = '\0';
      std::condition_variable::notify_one();
      std::mutex::unlock((mutex *)0x17e972);
    }
  }
  return;
}

Assistant:

void AbstractTaskProvider::_taskRun( bool skip )
{
    const size_t taskId = _givenTaskCount++;

    if( taskId < _taskCount ) {
        if( !skip ) {
            try {
                _task( taskId );
            }
            catch( ... ) {
                // here should be some logging code stating about an exception
                // or add your code to feedback about an exception
                _exceptionRaised = true;
            }
        }

        const size_t completedTasks = (++_completedTaskCount);

        if( completedTasks == _taskCount ) {
            _completion.lock();

            _running = false;
            _waiting.notify_one();

            _completion.unlock();
        }
    }
}